

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O1

void __thiscall
Assimp::SplitLargeMeshesProcess_Triangle::Execute
          (SplitLargeMeshesProcess_Triangle *this,aiScene *pScene)

{
  uint uVar1;
  Logger *pLVar2;
  aiMesh **ppaVar3;
  ulong uVar4;
  ulong uVar5;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  avList;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  local_38;
  
  if ((pScene != (aiScene *)0x0) && (this->LIMIT != 0xffffffff)) {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"SplitLargeMeshesProcess_Triangle begin");
    local_38.
    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = (ulong)pScene->mNumMeshes;
    if (pScene->mNumMeshes != 0) {
      uVar5 = 0;
      do {
        SplitMesh(this,(uint)uVar5,pScene->mMeshes[uVar5],&local_38);
        uVar5 = uVar5 + 1;
        uVar4 = (ulong)pScene->mNumMeshes;
      } while (uVar5 < uVar4);
    }
    if ((long)local_38.
              super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar4) {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"SplitLargeMeshesProcess_Triangle finished. There was nothing to do");
    }
    else {
      if (pScene->mMeshes != (aiMesh **)0x0) {
        operator_delete__(pScene->mMeshes);
      }
      uVar4 = (long)local_38.
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pScene->mNumMeshes = (uint)uVar4;
      ppaVar3 = (aiMesh **)
                operator_new__(-(ulong)(uVar4 >> 0x3d != 0) |
                               (long)local_38.
                                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_38.
                                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 1);
      pScene->mMeshes = ppaVar3;
      if (local_38.
          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_38.
          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar1 = 1;
        uVar4 = 0;
        do {
          pScene->mMeshes[uVar4] =
               local_38.
               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].first;
          uVar4 = (ulong)uVar1;
          uVar1 = uVar1 + 1;
        } while (uVar4 < (ulong)((long)local_38.
                                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_38.
                                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      UpdateNode(pScene->mRootNode,&local_38);
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"SplitLargeMeshesProcess_Triangle finished. Meshes have been split");
    }
    if (local_38.
        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::Execute( aiScene* pScene) {
    if (0xffffffff == this->LIMIT || nullptr == pScene ) {
        return;
    }

    ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Triangle begin");
    std::vector<std::pair<aiMesh*, unsigned int> > avList;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
        this->SplitMesh(a, pScene->mMeshes[a],avList);
    }

    if (avList.size() != pScene->mNumMeshes) {
        // it seems something has been split. rebuild the mesh list
        delete[] pScene->mMeshes;
        pScene->mNumMeshes = (unsigned int)avList.size();
        pScene->mMeshes = new aiMesh*[avList.size()];

        for (unsigned int i = 0; i < avList.size();++i) {
            pScene->mMeshes[i] = avList[i].first;
        }

        // now we need to update all nodes
        this->UpdateNode(pScene->mRootNode,avList);
        ASSIMP_LOG_INFO("SplitLargeMeshesProcess_Triangle finished. Meshes have been split");
    } else {
        ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Triangle finished. There was nothing to do");
    }
}